

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_service_interface(t_dart_generator *this,t_service *tservice)

{
  bool bVar1;
  t_service *ptVar2;
  ostream *poVar3;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar4;
  string local_1a8;
  string local_188;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_168;
  t_function **local_160;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_158;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0 [8];
  string class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator local_39;
  string local_38 [8];
  string extends_iface;
  t_service *tservice_local;
  t_dart_generator *this_local;
  
  extends_iface.field_2._8_8_ = tservice;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  ptVar2 = t_service::get_extends((t_service *)extends_iface.field_2._8_8_);
  if (ptVar2 != (t_service *)0x0) {
    ptVar2 = t_service::get_extends((t_service *)extends_iface.field_2._8_8_);
    get_ttype_class_name_abi_cxx11_
              ((string *)((long)&class_name.field_2 + 8),this,&ptVar2->super_t_type);
    std::operator+(&local_70," extends ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&class_name.field_2 + 8));
    std::__cxx11::string::operator=(local_38,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)(class_name.field_2._M_local_buf + 8));
  }
  generate_dart_doc(this,(ostream *)&this->f_service_,(t_doc *)extends_iface.field_2._8_8_);
  std::__cxx11::string::string
            (local_b0,(string *)&(this->super_t_oop_generator).super_t_generator.service_name_);
  std::__cxx11::string::string
            ((string *)&local_f0,
             (string *)&(this->super_t_oop_generator).super_t_generator.service_name_);
  get_file_name(&local_d0,this,&local_f0);
  std::__cxx11::string::string((string *)&local_110,local_b0);
  export_class_to_library(this,&local_d0,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar3 = std::operator<<(poVar3,"abstract class ");
  poVar3 = std::operator<<(poVar3,local_b0);
  std::operator<<(poVar3,local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_130," ",
             (allocator *)
             ((long)&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  scope_up(this,(ostream *)&this->f_service_,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  __x = t_service::get_functions((t_service *)extends_iface.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_158);
  local_160 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_158._M_current = local_160;
  while( true ) {
    local_168._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=(&local_158,&local_168);
    if (!bVar1) break;
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_158);
    generate_dart_doc(this,(ostream *)&this->f_service_,*pptVar4);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_158);
    function_signature_abi_cxx11_(&local_188,this,*pptVar4);
    poVar3 = std::operator<<(poVar3,(string *)&local_188);
    poVar3 = std::operator<<(poVar3,";");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_188);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_158);
  }
  std::__cxx11::string::string((string *)&local_1a8,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)&this->f_service_,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void t_dart_generator::generate_service_interface(t_service* tservice) {
  string extends_iface = "";
  if (tservice->get_extends() != nullptr) {
    extends_iface = " extends " + get_ttype_class_name(tservice->get_extends());
  }

  generate_dart_doc(f_service_, tservice);

  string class_name = service_name_;
  export_class_to_library(get_file_name(service_name_), class_name);
  indent(f_service_) << "abstract class " << class_name << extends_iface;
  scope_up(f_service_);

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_service_ << endl;
    generate_dart_doc(f_service_, *f_iter);
    indent(f_service_) << function_signature(*f_iter) << ";" << endl;
  }

  scope_down(f_service_, endl2);
}